

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O0

int asl::local8toUtf32(char *u,int *p,int n)

{
  int *piVar1;
  int c;
  int *p0;
  int *piStack_18;
  int n_local;
  int *p_local;
  char *u_local;
  
  p0._4_4_ = n;
  piStack_18 = p;
  p_local = (int *)u;
  do {
    if ((char)*p_local == 0) break;
    piVar1 = piStack_18 + 1;
    *piStack_18 = (int)(char)*p_local;
    p0._4_4_ = p0._4_4_ + -1;
    piStack_18 = piVar1;
    p_local = (int *)((long)p_local + 1);
  } while (p0._4_4_ != 0);
  *piStack_18 = 0;
  return (int)((long)piStack_18 - (long)p >> 2);
}

Assistant:

int local8toUtf32(const char* u, int* p, int n)
{
	const int* p0 = p;
	while (int c = *u++)
	{
		*p++ = c;
		if (--n == 0)
			break;
	}
	*p = 0;
	return int(p - p0);
}